

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomControlPdu.cpp
# Opt level: O2

int __thiscall DIS::IntercomControlPdu::getMarshalledSize(IntercomControlPdu *this)

{
  pointer pIVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  IntercomCommunicationsParameters listElement;
  
  iVar2 = RadioCommunicationsFamilyPdu::getMarshalledSize(&this->super_RadioCommunicationsFamilyPdu)
  ;
  iVar3 = EntityID::getMarshalledSize(&this->_sourceEntityID);
  iVar4 = EntityID::getMarshalledSize(&this->_masterEntityID);
  iVar2 = iVar4 + iVar3 + iVar2 + 0xd;
  lVar6 = 8;
  for (uVar5 = 0;
      pIVar1 = (this->_intercomParameters).
               super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_intercomParameters).
                            super__Vector_base<DIS::IntercomCommunicationsParameters,_std::allocator<DIS::IntercomCommunicationsParameters>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 4);
      uVar5 = uVar5 + 1) {
    listElement._vptr_IntercomCommunicationsParameters =
         (_func_int **)&PTR__IntercomCommunicationsParameters_001b1438;
    listElement._8_8_ =
         *(undefined8 *)((long)&pIVar1->_vptr_IntercomCommunicationsParameters + lVar6);
    iVar3 = IntercomCommunicationsParameters::getMarshalledSize(&listElement);
    iVar2 = iVar2 + iVar3;
    IntercomCommunicationsParameters::~IntercomCommunicationsParameters(&listElement);
    lVar6 = lVar6 + 0x10;
  }
  return iVar2;
}

Assistant:

int IntercomControlPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = RadioCommunicationsFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 1;  // _controlType
   marshalSize = marshalSize + 1;  // _communicationsChannelType
   marshalSize = marshalSize + _sourceEntityID.getMarshalledSize();  // _sourceEntityID
   marshalSize = marshalSize + 1;  // _sourceCommunicationsDeviceID
   marshalSize = marshalSize + 1;  // _sourceLineID
   marshalSize = marshalSize + 1;  // _transmitPriority
   marshalSize = marshalSize + 1;  // _transmitLineState
   marshalSize = marshalSize + 1;  // _command
   marshalSize = marshalSize + _masterEntityID.getMarshalledSize();  // _masterEntityID
   marshalSize = marshalSize + 2;  // _masterCommunicationsDeviceID
   marshalSize = marshalSize + 4;  // _intercomParametersLength

   for(unsigned long long idx=0; idx < _intercomParameters.size(); idx++)
   {
        IntercomCommunicationsParameters listElement = _intercomParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}